

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,int *args,unsigned_long *args_1,int *args_2)

{
  Printer *this_00;
  int x;
  unsigned_long x_00;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_b1;
  char *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = this->printer_;
  local_b0 = format;
  ToString<int,void>(&local_90,(Formatter *)(ulong)(uint)*args,(int)args);
  ToString<unsigned_long,void>(&local_70,(Formatter *)*args_1,x_00);
  ToString<int,void>(&local_50,(Formatter *)(ulong)(uint)*args_2,x);
  __l._M_len = 3;
  __l._M_array = &local_90;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a8,__l,&local_b1);
  io::Printer::FormatInternal(this_00,&local_a8,&this->vars_,local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_90._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }